

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void DumpLiterals(OutputStream *stream,SQObjectPtr *_literals,SQInt32 _nliterals)

{
  int in_EDX;
  SQObjectPtr *in_RDI;
  SQInt32 i;
  uint local_18;
  
  streamprintf((OutputStream *)in_RDI,"-----LITERALS\n");
  for (local_18 = 0; (int)local_18 < in_EDX; local_18 = local_18 + 1) {
    streamprintf((OutputStream *)in_RDI,"[%d] ",(ulong)local_18);
    DumpLiteral((OutputStream *)CONCAT44(_nliterals,i),in_RDI);
    streamprintf((OutputStream *)in_RDI,"\n");
  }
  return;
}

Assistant:

void DumpLiterals(OutputStream *stream, const SQObjectPtr *_literals, SQInt32 _nliterals)
{
    streamprintf(stream, _SC("-----LITERALS\n"));
    for (SQInt32 i = 0; i < _nliterals; ++i) {
        streamprintf(stream, _SC("[%d] "), (SQInt32)i);
        DumpLiteral(stream, _literals[i]);
        streamprintf(stream, _SC("\n"));
    }
}